

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

SSTableHeader * SSTable::readHeader(SSTableHeader *__return_storage_ptr__,string *fileName)

{
  runtime_error *this;
  uint64_t maxKey;
  uint64_t minKey;
  uint64_t length;
  uint64_t timeStamp;
  ifstream in;
  byte abStack_208 [488];
  
  std::ifstream::ifstream(&in,(string *)fileName,_S_in|_S_bin);
  if ((abStack_208[*(long *)(_in + -0x18)] & 5) == 0) {
    read64(&in,&timeStamp);
    read64(&in,&length);
    read64(&in,&minKey);
    read64(&in,&maxKey);
    std::ifstream::close();
    __return_storage_ptr__->timeStamp = timeStamp;
    __return_storage_ptr__->length = length;
    __return_storage_ptr__->minKey = minKey;
    __return_storage_ptr__->maxKey = maxKey;
    std::ifstream::~ifstream(&in);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&length,
                 "readHeader: Open file ",fileName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&timeStamp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&length,
                 " failed!");
  std::runtime_error::runtime_error(this,(string *)&timeStamp);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SSTableHeader SSTable::readHeader(const string &fileName) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readHeader: Open file " + fileName + " failed!");
  uint64_t timeStamp, length, minKey, maxKey;
  read64(in, timeStamp);
  read64(in, length);
  read64(in, minKey);
  read64(in, maxKey);
  in.close();
  return SSTableHeader(timeStamp, length, minKey, maxKey);
}